

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Get_Track_Kerning(FT_Face face,FT_Fixed point_size,FT_Int degree,FT_Fixed *akerning)

{
  FT_Driver pFVar1;
  undefined8 *local_50;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Error error;
  FT_Service_Kerning service;
  FT_Fixed *akerning_local;
  FT_Int degree_local;
  FT_Fixed point_size_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (akerning == (FT_Fixed *)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    pFVar1 = face->driver;
    local_50 = (undefined8 *)0x0;
    if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
      local_50 = (undefined8 *)(*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"kerning");
    }
    if (local_50 == (undefined8 *)0x0) {
      face_local._4_4_ = 7;
    }
    else {
      face_local._4_4_ = (*(code *)*local_50)(face,point_size,degree,akerning);
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Track_Kerning( FT_Face    face,
                        FT_Fixed   point_size,
                        FT_Int     degree,
                        FT_Fixed*  akerning )
  {
    FT_Service_Kerning  service;
    FT_Error            error = FT_Err_Ok;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !akerning )
      return FT_THROW( Invalid_Argument );

    FT_FACE_FIND_SERVICE( face, service, KERNING );
    if ( !service )
      return FT_THROW( Unimplemented_Feature );

    error = service->get_track( face,
                                point_size,
                                degree,
                                akerning );

    return error;
  }